

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint c;
  bool bVar6;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0x1d8,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit0 < 2) {
    bVar6 = iLit0 != 0;
    iLit0 = iLit1;
    iVar3 = iLit1;
    if (bVar6) {
LAB_0057a6da:
      iVar3 = Abc_LitNot(iLit0);
      return iVar3;
    }
  }
  else if (iLit1 < 2) {
    iVar3 = iLit0;
    if (iLit1 != 0) goto LAB_0057a6da;
  }
  else {
    iVar3 = 0;
    if (iLit0 != iLit1) {
      iVar3 = Abc_LitNot(iLit1);
      if (iVar3 != iLit0) {
        if (((char)p->nObjs == '\0') &&
           (iVar3 = p->nHTable, iVar4 = Gia_ManAndNum(p), iVar3 * 2 < iVar4)) {
          Gia_ManHashResize(p);
        }
        iVar3 = iLit1;
        if ((uint)iLit0 >= (uint)iLit1 && iLit0 != iLit1) {
          iVar3 = iLit0;
        }
        if ((uint)iLit0 < (uint)iLit1) {
          iLit1 = iLit0;
        }
        iVar4 = Abc_LitIsCompl(iVar3);
        if (iVar4 != 0) {
          iVar3 = Abc_LitNot(iVar3);
        }
        c = (uint)(iVar4 != 0);
        iVar4 = Abc_LitIsCompl(iLit1);
        if (iVar4 != 0) {
          iLit1 = Abc_LitNot(iLit1);
          c = c ^ 1;
        }
        piVar5 = Gia_ManHashFind(p,iVar3,iLit1,-1);
        iVar4 = *piVar5;
        if (iVar4 == 0) {
          p->nHashMiss = p->nHashMiss + 1;
          iVar1 = p->nObjs;
          iVar2 = p->nObjsAlloc;
          iVar4 = Gia_ManAppendXorReal(p,iVar3,iLit1);
          if ((iVar2 <= iVar1) && (piVar5 = Gia_ManHashFind(p,iVar3,iLit1,-1), *piVar5 != 0)) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                          ,0x1f7,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
          }
          *piVar5 = iVar4;
        }
        else {
          p->nHashHit = p->nHashHit + 1;
        }
        iVar3 = Abc_LitNotCond(iVar4,c);
        return iVar3;
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int Gia_ManHashXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLit0 < 2 )
        return iLit0 ? Abc_LitNot(iLit1) : iLit1;
    if ( iLit1 < 2 )
        return iLit1 ? Abc_LitNot(iLit0) : iLit0;
    if ( iLit0 == iLit1 )
        return 0;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 1;
    if ( (p->nObjs & 0xFF) == 0 && 2 * p->nHTable < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( iLit0 < iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    if ( Abc_LitIsCompl(iLit0) )
        iLit0 = Abc_LitNot(iLit0), fCompl ^= 1;
    if ( Abc_LitIsCompl(iLit1) )
        iLit1 = Abc_LitNot(iLit1), fCompl ^= 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_LitNotCond( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( p->nObjs < p->nObjsAlloc )
            *pPlace = Gia_ManAppendXorReal( p, iLit0, iLit1 );
        else
        {
            int iNode = Gia_ManAppendXorReal( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = iNode;
        }
        return Abc_LitNotCond( *pPlace, fCompl );
    }
}